

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O3

void __thiscall
tst_deprecations_helpers_qpromiseall::atLeastOnePromiseReject
          (tst_deprecations_helpers_qpromiseall *this)

{
  QSharedData *pQVar1;
  long lVar2;
  long *plVar3;
  QArrayData *pQVar4;
  PromiseResolver<int> PVar5;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> QVar6;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar7;
  char cVar8;
  bool bVar9;
  QPromise<int> *data;
  PromiseData<int> *pPVar10;
  QObject *pQVar11;
  int *piVar12;
  QEvent *this_00;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  PromiseData<QList<int>_> *this_01;
  ulong uVar16;
  long lVar17;
  char *reject;
  QSharedData *pQVar18;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar19;
  QByteArrayView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QArrayData *local_130;
  Data *local_128;
  QArrayData **local_120;
  PromiseResolver<int> resolver;
  _Manager_type local_108;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_f8;
  PromiseResolver<QList<int>_> resolver_1;
  PromiseData<int> *local_e8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_e0;
  _Any_data local_d8;
  undefined **local_c8;
  PromiseData<int> *local_c0;
  undefined **local_b8;
  PromiseData<int> *local_b0;
  QPromise<QList<int>_> p;
  Type p1;
  Type p0;
  QArrayData *local_78;
  storage_type_conflict *psStack_70;
  qsizetype local_68;
  QSharedData *local_58;
  QPromise<QList<int>_> local_50;
  int *local_40;
  QObject *local_38;
  
  local_d8._0_4_ = 0x2a;
  QtPromise::resolve<int>((QtPromise *)&p0,(int *)local_d8._M_pod_data);
  local_d8._0_4_ = 0x2c;
  QtPromise::resolve<int>((QtPromise *)&p1,(int *)local_d8._M_pod_data);
  pPVar10 = (PromiseData<int> *)operator_new(0x68);
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0012dc58;
  QReadWriteLock::QReadWriteLock
            (&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0012dbf0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar18 = &(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar18 = &(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_58 = &(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  local_d8._M_unused._M_object = &PTR__QPromiseBase_0012dbb8;
  local_e8 = pPVar10;
  local_d8._8_8_ = pPVar10;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_d8);
  local_d8._M_unused._M_object = &PTR__QPromiseBase_0012d950;
  if ((PromiseDataBase<int,_void_(const_int_&)> *)local_d8._8_8_ !=
      (PromiseDataBase<int,_void_(const_int_&)> *)0x0) {
    LOCK();
    pQVar18 = (QSharedData *)(local_d8._8_8_ + 8);
    (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<int,_void_(const_int_&)> *)local_d8._8_8_ !=
        (PromiseDataBase<int,_void_(const_int_&)> *)0x0)) {
      (**(code **)(*(long *)local_d8._8_8_ + 8))();
    }
  }
  PVar5.m_d.d = resolver.m_d.d;
  bVar9 = true;
  if (resolver.m_d.d == (Data *)0x0) {
LAB_00106464:
    QVar19.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    if (resolver.m_d.d == (Data *)0x0) goto LAB_00106464;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    bVar9 = false;
    QVar19 = resolver.m_d.d;
  }
  pQVar11 = (QObject *)QThread::currentThread();
  if ((pQVar11 != (QObject *)0x0) &&
     (piVar12 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar11), local_40 = piVar12
     , local_38 = pQVar11, piVar12 != (int *)0x0)) {
    if ((piVar12[1] != 0) && (cVar8 = QThread::isFinished(), cVar8 == '\0')) {
      if (piVar12[1] == 0) {
        pQVar11 = (QObject *)(QThread *)0x0;
      }
      pQVar11 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar11);
      if ((pQVar11 != (QObject *)0x0) || (cVar8 = QCoreApplication::closingDown(), cVar8 == '\0')) {
        this_00 = (QEvent *)operator_new(0x18);
        QEvent::QEvent(this_00,None);
        *(undefined ***)this_00 = &PTR__Event_0012d770;
        *(Data **)(this_00 + 0x10) = QVar19.d;
        if (!bVar9) {
          LOCK();
          ((QVar19.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               ((QVar19.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QCoreApplication::postEvent(pQVar11,this_00,0);
        piVar12 = local_40;
        if (local_40 == (int *)0x0) goto LAB_00106549;
      }
    }
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      piVar12 = local_40;
      if (local_40 == (int *)0x0) {
        piVar12 = (int *)0x0;
      }
      operator_delete(piVar12);
    }
  }
LAB_00106549:
  if (!bVar9) {
    LOCK();
    ((QVar19.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar19.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar19.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar19.d,0x10);
    }
    LOCK();
    ((QVar19.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar19.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar19.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar19.d,0x10);
    }
  }
  if (PVar5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar5.m_d.d == 0) {
      operator_delete((void *)PVar5.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  local_d8._8_8_ = p0.super_QPromiseBase<int>.m_d.d;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar18 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d8._M_unused._M_object = &PTR__QPromiseBase_0012dbb8;
  local_c0 = local_e8;
  LOCK();
  pQVar18 = &(local_e8->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_c8 = &PTR__QPromiseBase_0012dbb8;
  local_b0 = p1.super_QPromiseBase<int>.m_d.d;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar18 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8 = &PTR__QPromiseBase_0012dbb8;
  lVar13 = QArrayData::allocate((QArrayData **)&resolver,0x10,8,3,KeepSize);
  local_108 = (_Manager_type)0x0;
  uVar16 = 0xfffffffffffffff0;
  do {
    lVar17 = (long)local_108 * 0x10;
    *(undefined ***)(lVar13 + lVar17) = &PTR__QPromiseBase_0012d950;
    lVar2 = *(long *)((long)&local_c0 + uVar16);
    *(long *)(lVar13 + 8 + lVar17) = lVar2;
    if (lVar2 != 0) {
      LOCK();
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      UNLOCK();
    }
    *(undefined ***)(lVar17 + lVar13) = &PTR__QPromiseBase_0012dbb8;
    local_108 = local_108 + 1;
    uVar16 = uVar16 + 0x10;
  } while (uVar16 < 0x20);
  QtPromise::all<int,_QList>((QtPromise *)&p,(QList<QtPromise::QPromise<int>_> *)&resolver);
  QArrayDataPointer<QtPromise::QPromise<int>_>::~QArrayDataPointer
            ((QArrayDataPointer<QtPromise::QPromise<int>_> *)&resolver);
  lVar13 = 0x30;
  do {
    *(undefined ***)((long)&local_e8 + lVar13) = &PTR__QPromiseBase_0012d950;
    lVar2 = *(long *)((long)&local_e0.d + lVar13);
    if (lVar2 != 0) {
      LOCK();
      piVar12 = (int *)(lVar2 + 8);
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if ((*piVar12 == 0) &&
         (plVar3 = *(long **)((long)&local_e0.d + lVar13), plVar3 != (long *)0x0)) {
        (**(code **)(*plVar3 + 8))();
      }
    }
    QVar7.d = p0.super_QPromiseBase<int>.m_d.d;
    lVar13 = lVar13 + -0x10;
  } while (lVar13 != 0);
  bVar9 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p0.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  bVar9 = (bool)(~bVar9 & ((QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data
                          ._M_exception_object == (void *)0x0);
  resolver.m_d.d._0_1_ = 1;
  local_d8._M_pod_data[0] = bVar9;
  pcVar14 = QTest::toString<bool>((bool *)local_d8._M_pod_data);
  pcVar15 = QTest::toString<bool>((bool *)&resolver);
  cVar8 = QTest::compare_helper
                    (bVar9,"Compared values are not the same",pcVar14,pcVar15,"p0.isFulfilled()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0x98);
  QVar7 = p1.super_QPromiseBase<int>.m_d;
  if (cVar8 == '\0') goto LAB_00106cee;
  bVar9 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p1.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  bVar9 = (bool)(~bVar9 & ((QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data
                          ._M_exception_object == (void *)0x0);
  resolver.m_d.d._0_1_ = 1;
  local_d8._M_pod_data[0] = bVar9;
  pcVar14 = QTest::toString<bool>((bool *)local_d8._M_pod_data);
  pcVar15 = QTest::toString<bool>((bool *)&resolver);
  cVar8 = QTest::compare_helper
                    (bVar9,"Compared values are not the same",pcVar14,pcVar15,"p1.isFulfilled()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0x99);
  if (cVar8 == '\0') goto LAB_00106cee;
  bVar9 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&local_e8->super_PromiseDataBase<int,_void_(const_int_&)>);
  resolver.m_d.d._0_1_ = 1;
  local_d8._M_pod_data[0] = bVar9;
  pcVar14 = QTest::toString<bool>((bool *)local_d8._M_pod_data);
  pcVar15 = QTest::toString<bool>((bool *)&resolver);
  cVar8 = QTest::compare_helper
                    (bVar9,"Compared values are not the same",pcVar14,pcVar15,"p2.isPending()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0x9a);
  if (cVar8 == '\0') goto LAB_00106cee;
  bVar9 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    (&(p.super_QPromiseBase<QList<int>_>.m_d.d)->
                      super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
  resolver.m_d.d._0_1_ = 1;
  local_d8._M_pod_data[0] = bVar9;
  pcVar14 = QTest::toString<bool>((bool *)local_d8._M_pod_data);
  pcVar15 = QTest::toString<bool>((bool *)&resolver);
  reject = "p.isPending()";
  cVar8 = QTest::compare_helper
                    (bVar9,"Compared values are not the same",pcVar14,pcVar15,"p.isPending()","true"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0x9b);
  if (cVar8 == '\0') goto LAB_00106cee;
  local_78 = (QArrayData *)0x0;
  psStack_70 = (storage_type_conflict *)0x0;
  local_68 = 0;
  this_01 = (PromiseData<QList<int>_> *)operator_new(0x68);
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (this_01->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0
  ;
  *(undefined8 *)&(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled
       = 0;
  (this_01->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0012daf8;
  QReadWriteLock::QReadWriteLock
            (&(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock,0);
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = false;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0012da90;
  (this_01->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_01->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar18 = &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
             super_QSharedData;
  (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar18 = &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
             super_QSharedData;
  (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar18 = &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
             super_QSharedData;
  local_50.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_0012da58;
  local_50.super_QPromiseBase<QList<int>_>.m_d.d = this_01;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver(&resolver_1,&local_50);
  local_50.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_0012d8f0;
  if (local_50.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_50.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_50.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((local_50.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  QVar6.d = p.super_QPromiseBase<QList<int>_>.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_f8.d = (Data *)0x0;
LAB_001069be:
    local_e0.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_f8 = resolver_1.m_d.d;
    if (resolver_1.m_d.d == (Data *)0x0) goto LAB_001069be;
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_e0 = resolver_1.m_d.d;
  }
  QtPromisePrivate::PromiseHandler<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            ((function<void_(const_QList<int>_&)> *)&local_d8,
             (PromiseHandler<QList<int>,decltype(nullptr),void> *)0x0,&local_f8,
             (QPromiseResolve<QList<int>_> *)&local_e0,(QPromiseReject<QList<int>_> *)reject);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            (&(QVar6.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,
             (function<void_(const_QList<int>_&)> *)&local_d8);
  if (local_c8 != (undefined **)0x0) {
    (*(code *)local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  local_130 = (QArrayData *)local_f8.d;
  if ((QArrayData *)local_f8.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_f8.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_f8.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_128 = local_e0.d;
  if (local_e0.d != (Data *)0x0) {
    LOCK();
    *(int *)&((QPromiseBase<int> *)&(local_e0.d)->super_QSharedData)->_vptr_QPromiseBase =
         *(int *)&((QPromiseBase<int> *)&(local_e0.d)->super_QSharedData)->_vptr_QPromiseBase + 1;
    UNLOCK();
  }
  local_120 = &local_78;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       operator_new(0x18);
  *(QArrayData **)resolver.m_d.d = local_130;
  if (local_130 != (QArrayData *)0x0) {
    LOCK();
    (local_130->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_130->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<int> *)local_128;
  if (local_128 == (Data *)0x0) {
    *(QArrayData ***)((long)resolver.m_d.d + 0x10) = local_120;
  }
  else {
    LOCK();
    *(int *)&((QPromiseBase<int> *)&local_128->super_QSharedData)->_vptr_QPromiseBase =
         *(int *)&((QPromiseBase<int> *)&local_128->super_QSharedData)->_vptr_QPromiseBase + 1;
    UNLOCK();
    *(QArrayData ***)((long)resolver.m_d.d + 0x10) = local_120;
    if (local_128 != (Data *)0x0) {
      LOCK();
      *(int *)&((QPromiseBase<int> *)&local_128->super_QSharedData)->_vptr_QPromiseBase =
           *(int *)&((QPromiseBase<int> *)&local_128->super_QSharedData)->_vptr_QPromiseBase + -1;
      UNLOCK();
      if (*(int *)&((QPromiseBase<int> *)&local_128->super_QSharedData)->_vptr_QPromiseBase == 0) {
        operator_delete(local_128,0x10);
      }
    }
  }
  if (local_130 != (QArrayData *)0x0) {
    LOCK();
    (local_130->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_130->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_130->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_130,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            (&(QVar6.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  std::
  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
  ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  if (local_e0.d != (Data *)0x0) {
    LOCK();
    *(int *)&((QPromiseBase<int> *)&(local_e0.d)->super_QSharedData)->_vptr_QPromiseBase =
         *(int *)&((QPromiseBase<int> *)&(local_e0.d)->super_QSharedData)->_vptr_QPromiseBase + -1;
    UNLOCK();
    if (*(int *)&((QPromiseBase<int> *)&(local_e0.d)->super_QSharedData)->_vptr_QPromiseBase == 0) {
      operator_delete(local_e0.d,0x10);
    }
  }
  if ((QArrayData *)local_f8.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_f8.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_f8.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_f8.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i == 0) {
      operator_delete(local_f8.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  QVar6.d = p.super_QPromiseBase<QList<int>_>.m_d.d;
  bVar9 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    (&(p.super_QPromiseBase<QList<int>_>.m_d.d)->
                      super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
  if (!bVar9) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
              (&(QVar6.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
  }
  bVar9 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this_01);
  while (bVar9 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar9 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                      ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this_01);
  }
  LOCK();
  (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase
      [1])(this_01);
  }
  LOCK();
  (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase
      [1])(this_01);
  }
  QVar20.m_data = (storage_type *)0x3;
  QVar20.m_size = (qsizetype)&local_130;
  QString::fromUtf8(QVar20);
  pQVar4 = local_130;
  QVar21.m_data = psStack_70;
  QVar21.m_size = local_68;
  QVar22.m_data = (storage_type_conflict *)local_128;
  QVar22.m_size = (qsizetype)local_120;
  cVar8 = QTest::qCompare(QVar21,QVar22,"waitForError(p, QString{})","QString{\"foo\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                          ,0x9c);
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,8);
    }
  }
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,8);
    }
  }
  pPVar10 = local_e8;
  if (cVar8 != '\0') {
    bVar9 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&local_e8->super_PromiseDataBase<int,_void_(const_int_&)>);
    bVar9 = (bool)(~bVar9 & (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data
                            ._M_exception_object != (void *)0x0);
    local_130 = (QArrayData *)CONCAT71(local_130._1_7_,bVar9);
    local_78 = (QArrayData *)CONCAT71(local_78._1_7_,1);
    pcVar14 = QTest::toString<bool>((bool *)&local_130);
    pcVar15 = QTest::toString<bool>((bool *)&local_78);
    QTest::compare_helper
              (bVar9,"Compared values are not the same",pcVar14,pcVar15,"p2.isRejected()","true",
               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
               ,0x9d);
  }
LAB_00106cee:
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d8f0;
  if (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar18 = &((p.super_QPromiseBase<QList<int>_>.m_d.d)->
               super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  LOCK();
  (local_58->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_58->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_58->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(local_e8->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
  }
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d950;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar18 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d950;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar18 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar18->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_deprecations_helpers_qpromiseall::atLeastOnePromiseReject()
{
    auto p0 = QtPromise::resolve(42);
    auto p1 = QtPromise::resolve(44);
    auto p2 = QtPromise::QPromise<int>{
        [](const QtPromise::QPromiseResolve<int>&, const QtPromise::QPromiseReject<int>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    auto p = QtPromise::qPromiseAll(QVector<QtPromise::QPromise<int>>{p0, p2, p1});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p2.isRejected(), true);
}